

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O2

bool __thiscall
gl3cts::TextureSwizzle::FunctionalTest::fillMSTexture
          (FunctionalTest *this,size_t format_idx,size_t target_idx)

{
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  undefined4 extraout_var;
  TestError *this_00;
  programInfo program;
  long lVar4;
  
  iVar3 = *(int *)(texture_targets + target_idx * 0x30 + 0x28);
  iVar1 = (*((this->super_SmokeTest).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])
                    ();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x78))(0x8d40,(this->super_SmokeTest).m_prepare_fbo_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"BindFramebuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xf6b);
  if (iVar3 == 0x9102) {
    (**(code **)(lVar4 + 0x6b8))(0x8d40,0x8ce0,(this->super_SmokeTest).m_source_tex_id,0,0);
    iVar3 = 0xf7a;
  }
  else {
    if (iVar3 != 0x9100) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                 ,0xf7f);
      goto LAB_0092981a;
    }
    (**(code **)(lVar4 + 0x6a0))(0x8d40,0x8ce0,0x9100,(this->super_SmokeTest).m_source_tex_id,0);
    iVar3 = 0xf73;
  }
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"FramebufferTexture2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,iVar3);
  iVar3 = (**(code **)(lVar4 + 0x170))(0x8d40);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"CheckFramebufferStatus",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xf85);
  if (iVar3 == 0x8cdd) {
    (**(code **)(lVar4 + 0x78))(0x8d40,0);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"BindFramebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xf8b);
  }
  else {
    if (iVar3 != 0x8cd5) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Framebuffer is incomplete. Format is supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                 ,0xf91);
LAB_0092981a:
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar4 + 0x1a00))(0,0,8);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Viewport",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xf96);
    program.m_context = (this->super_SmokeTest).super_TestCase.m_context;
    program.m_fragment_shader_id = 0;
    program.m_program_object_id = 0;
    program.m_vertex_shader_id = 0;
    prepareProgram(this,format_idx,&program);
    (**(code **)(lVar4 + 0x1680))(program.m_program_object_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"UseProgram",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xf9c);
    (**(code **)(lVar4 + 0x188))(0x4000);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Clear",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,4000);
    (**(code **)(lVar4 + 0x538))(5,0,4);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"DrawArrays",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xfa4);
    (**(code **)(lVar4 + 0x78))(0x8d40,0);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"BindFramebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xfa8);
    Utils::programInfo::~programInfo(&program);
  }
  return iVar3 != 0x8cdd;
}

Assistant:

bool FunctionalTest::fillMSTexture(size_t format_idx, size_t target_idx)
{
	const glw::GLenum target = texture_targets[target_idx].m_target;

	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind FBO */
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_prepare_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindFramebuffer");

	/* Attach texture */
	switch (target)
	{
	case GL_TEXTURE_2D_MULTISAMPLE:

		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, target, m_source_tex_id, 0 /* level */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "FramebufferTexture2D");

		break;

	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:

		gl.framebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_source_tex_id, 0 /* level */, 0 /* layer */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "FramebufferTexture2D");

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* Verify status */
	const glw::GLenum status = gl.checkFramebufferStatus(GL_FRAMEBUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "CheckFramebufferStatus");

	if (GL_FRAMEBUFFER_UNSUPPORTED == status)
	{
		/* Unbind */
		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindFramebuffer");

		return false;
	}
	else if (GL_FRAMEBUFFER_COMPLETE != status)
	{
		TCU_FAIL("Framebuffer is incomplete. Format is supported");
	}

	/* Set Viewport */
	gl.viewport(0 /* x */, 0 /* y */, m_output_width, m_output_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Viewport");

	Utils::programInfo program(m_context);
	prepareProgram(format_idx, program);

	gl.useProgram(program.m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

	/* Clear */
	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Clear");

	/* Draw */
	gl.drawArrays(GL_TRIANGLE_STRIP, 0 /* first */, 4 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	/* Unbind FBO */
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindFramebuffer");

	/* Done */
	return true;
}